

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurImage.cpp
# Opt level: O3

void blurImage(EnvmapImage *image1,bool verbose)

{
  Rgba *pRVar1;
  char cVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  Envmap EVar5;
  int iVar6;
  Box2i *pBVar7;
  ostream *poVar8;
  Array2D<Imf_3_2::Rgba> *pAVar9;
  long *plVar10;
  long lVar11;
  ulong extraout_RAX;
  Rgba *pRVar12;
  long lVar13;
  long lVar14;
  int f;
  int x;
  int iVar15;
  int iVar16;
  undefined7 in_register_00000031;
  uint16_t uVar17;
  uint uVar18;
  int x1;
  int iVar19;
  EnvmapImage *pEVar20;
  int f1;
  int iVar21;
  uint uVar22;
  Box *pBVar23;
  bool bVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  V2f posInFace1;
  V2f posInFace2;
  V2f pos2;
  Box2i dw;
  V2f posInFace;
  V2f pos;
  V3f dir1;
  V2f pos1;
  EnvmapImage image2;
  EnvmapImage *local_180;
  float fStack_178;
  undefined4 uStack_174;
  float fStack_170;
  float fStack_16c;
  float *pfStack_168;
  float fStack_160;
  float fStack_15c;
  float *pfStack_158;
  Array2D<Imf_3_2::Rgba> *pAStack_150;
  Box2i local_148;
  undefined8 local_130;
  Rgba *local_128;
  float fStack_120;
  float fStack_11c;
  float fStack_118;
  long lStack_110;
  undefined1 local_108 [16];
  Box2i BStack_f8;
  undefined8 uStack_e8;
  float fStack_e0;
  float fStack_dc;
  EnvmapImage *local_d0;
  EnvmapImage *local_c8;
  int iStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  float fStack_80;
  float fStack_7c;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  EnvmapImage local_60;
  
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"blurring map image",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  local_180 = &local_60;
  EnvmapImage::EnvmapImage(local_180);
  pBVar7 = EnvmapImage::dataWindow(image1);
  iVar21 = (pBVar7->max).x;
  pBVar7 = EnvmapImage::dataWindow(image1);
  iVar21 = iVar21 - (pBVar7->min).x;
  EVar5 = EnvmapImage::type(image1);
  uVar22 = iVar21 + 1;
  local_d0 = image1;
  if (EVar5 == ENVMAP_LATLONG) {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"    converting to cube-face format",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
    }
    uVar18 = iVar21 + 4;
    if (-1 < (int)uVar22) {
      uVar18 = uVar22;
    }
    uVar22 = (int)uVar18 >> 2;
    local_148.min.x = 0;
    local_148.min.y = 0;
    local_148.max.y = uVar22 * 6 + -1;
    local_148.max.x = uVar22 - 1;
    resizeCube(image1,&local_60,&local_148,1.0,7);
    local_d0 = &local_60;
    local_180 = image1;
  }
  local_c8 = image1;
  if (0x28 < (int)uVar22) {
    do {
      pEVar20 = local_d0;
      uVar18 = 0x28;
      if (0x4f < uVar22) {
        uVar18 = uVar22 >> 1;
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    resizing cube faces to ",0x1b);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," by ",4);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,uVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," pixels",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      local_148.min.x = 0;
      local_148.min.y = 0;
      local_148.max.y = uVar18 * 6 + -1;
      local_148.max.x = uVar18 - 1;
      resizeCube(pEVar20,local_180,&local_148,1.0,7);
      local_d0 = local_180;
      uVar22 = uVar22 >> 1;
      local_180 = pEVar20;
    } while (0x28 < uVar18);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"    computing pixel weights",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  pEVar20 = local_d0;
  pBVar7 = EnvmapImage::dataWindow(local_d0);
  local_148.min = pBVar7->min;
  local_148.max = pBVar7->max;
  local_130 = Imf_3_2::CubeMap::sizeOfFace((Box *)&local_148);
  pAVar9 = EnvmapImage::pixels(pEVar20);
  local_128 = (Rgba *)CONCAT44(local_128._4_4_,(int)local_130 + -1);
  uVar22 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_108._8_8_;
  local_108 = auVar3 << 0x40;
  do {
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        face ",0xd);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar22);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
    pAStack_150 = (Array2D<Imf_3_2::Rgba> *)&fStack_178;
    pfStack_168 = &fStack_160;
    pfStack_158 = &fStack_170;
    if (0 < (int)local_130) {
      iVar21 = 0;
      fStack_b8 = 0.0;
      do {
        bVar24 = iVar21 != (int)local_128;
        lStack_110 = CONCAT44(lStack_110._4_4_,(float)iVar21);
        iVar15 = 0;
        iStack_bc = iVar21;
        do {
          fStack_120 = (float)iVar15;
          bVar25 = (int)local_128 != iVar15;
          fStack_11c = (float)lStack_110;
          Imf_3_2::CubeMap::direction
                    ((CubeMapFace)&BStack_f8,(Box *)(ulong)uVar22,(Vec2 *)&local_148);
          auStack_98._4_4_ = BStack_f8.max.x;
          auStack_98._0_4_ = BStack_f8.min.y;
          auStack_98._8_8_ = 0;
          fVar32 = (float)BStack_f8.max.x * (float)BStack_f8.max.x +
                   (float)BStack_f8.min.x * (float)BStack_f8.min.x +
                   (float)BStack_f8.min.y * (float)BStack_f8.min.y;
          if (fVar32 < 2.3509887e-38) {
            uStack_e8 = (double)CONCAT44(uStack_e8._4_4_,BStack_f8.min.x);
            blurImage();
            if ((extraout_RAX & 1) == 0) {
              fVar32 = fStack_b4;
              goto LAB_00104586;
            }
            auStack_98 = ZEXT816(0);
            fStack_170 = 0.0;
          }
          else {
            uStack_e8._0_4_ = (float)BStack_f8.min.x;
            fVar32 = SQRT(fVar32);
LAB_00104586:
            fStack_170 = 0.0;
            if ((fVar32 != 0.0) || (NAN(fVar32))) {
              fStack_170 = (float)uStack_e8 / fVar32;
              auVar30._4_4_ = fVar32;
              auVar30._0_4_ = fVar32;
              auVar30._8_4_ = fVar32;
              auVar30._12_4_ = fVar32;
              auStack_98 = divps(auStack_98,auVar30);
            }
            else {
              auStack_98 = ZEXT816(0);
            }
          }
          auStack_a8._0_4_ = fStack_170;
          fStack_160 = auStack_98._0_4_;
          fStack_178 = auStack_98._4_4_;
          uStack_e8 = (double)CONCAT44(fStack_178,fStack_178);
          uStack_68 = CONCAT44(fStack_11c,fStack_120);
          fStack_e0 = fStack_178;
          fStack_dc = fStack_178;
          Imf_3_2::CubeMap::pixelPosition(&BStack_f8,uVar22,&local_148,&uStack_68);
          lVar13 = _imath_half_to_float_table;
          dVar27 = (double)(*pfStack_168 / *pfStack_158);
          dVar26 = (double)(*(float *)pAStack_150 / *pfStack_158);
          dVar27 = (dVar26 * dVar26 + dVar27 * dVar27 + 1.0) *
                   (double)((float)uStack_e8 * 0.0 +
                           (float)auStack_a8._0_4_ * 1.0 + fStack_b8 * (float)auStack_98._0_4_);
          if (iVar15 != 0 && bVar25 || bVar24 && iVar21 != 0) {
            if ((iVar15 == 0 || !bVar25) || (!bVar24 || iVar21 == 0)) {
              dVar27 = dVar27 * 0.5;
            }
          }
          else {
            dVar27 = dVar27 / 3.0;
          }
          lVar11 = (long)(int)((float)BStack_f8.min.y + 0.5) * pAVar9->_sizeY;
          pRVar1 = pAVar9->_data;
          lVar14 = (long)(int)((float)BStack_f8.min.x + 0.5);
          fVar29 = (float)dVar27;
          fVar31 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar11 + lVar14].r._h * 4)
                   * fVar29;
          fVar32 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar32 < 0x38800000) {
            if ((0x33000000 < (uint)fVar32) &&
               (uVar18 = (uint)fVar32 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar32 >> 0x17),
               uVar17 = uVar17 | (ushort)(uVar18 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar18 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar32 < 0x7f800000) {
            if ((uint)fVar32 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar32 != INFINITY) {
              uVar18 = (uint)fVar32 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar18 | (ushort)(uVar18 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].r._h = uVar17;
          fVar31 = *(float *)(lVar13 + (ulong)pRVar1[lVar11 + lVar14].g._h * 4) * fVar29;
          fVar32 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar32 < 0x38800000) {
            if ((0x33000000 < (uint)fVar32) &&
               (uVar18 = (uint)fVar32 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar32 >> 0x17),
               uVar17 = uVar17 | (ushort)(uVar18 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar18 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar32 < 0x7f800000) {
            if ((uint)fVar32 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar32 != INFINITY) {
              uVar18 = (uint)fVar32 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar18 | (ushort)(uVar18 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].g._h = uVar17;
          fVar31 = *(float *)(lVar13 + (ulong)pRVar1[lVar11 + lVar14].b._h * 4) * fVar29;
          fVar32 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar32 < 0x38800000) {
            if ((0x33000000 < (uint)fVar32) &&
               (cVar2 = (char)((uint)fVar32 >> 0x17), uVar18 = (uint)fVar32 & 0x7fffff | 0x800000,
               uVar17 = uVar17 | (ushort)(uVar18 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar18 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar32 < 0x7f800000) {
            if ((uint)fVar32 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar32 != INFINITY) {
              uVar18 = (uint)fVar32 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar18 | (ushort)(uVar18 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].b._h = uVar17;
          fVar29 = fVar29 * *(float *)(lVar13 + (ulong)pRVar1[lVar11 + lVar14].a._h * 4);
          fVar32 = ABS(fVar29);
          uVar17 = (ushort)((uint)fVar29 >> 0x10) & 0x8000;
          if ((uint)fVar32 < 0x38800000) {
            if ((0x33000000 < (uint)fVar32) &&
               (uVar18 = (uint)fVar32 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar32 >> 0x17),
               uVar17 = uVar17 | (ushort)(uVar18 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar18 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar32 < 0x7f800000) {
            if ((uint)fVar32 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar32 != INFINITY) {
              uVar18 = (uint)fVar32 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar18 | (ushort)(uVar18 == 0);
            }
          }
          pRVar1[lVar11 + lVar14].a._h = uVar17;
          local_108._0_8_ = (double)local_108._0_8_ + dVar27;
          iVar15 = iVar15 + 1;
        } while ((int)local_130 != iVar15);
        iVar21 = iStack_bc + 1;
      } while (iVar21 != (int)local_130);
    }
    pEVar20 = local_c8;
    lVar13 = _imath_half_to_float_table;
    uVar22 = uVar22 + 1;
    if (uVar22 == 6) {
      iVar21 = ((local_148.max.y - local_148.min.y) + 1) * ((local_148.max.x - local_148.min.x) + 1)
      ;
      if (0 < iVar21) {
        pRVar12 = pAVar9->_data;
        auVar28._8_4_ = iVar21 >> 0x1f;
        auVar28._0_8_ = (long)iVar21;
        auVar28._12_4_ = 0x45300000;
        pRVar1 = pRVar12 + iVar21;
        fVar32 = (float)(((auVar28._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,iVar21) - 4503599627370496.0)) /
                        (double)local_108._0_8_);
        do {
          fVar31 = *(float *)(lVar13 + (ulong)(pRVar12->r)._h * 4) * fVar32;
          fVar29 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar29 < 0x38800000) {
            if ((0x33000000 < (uint)fVar29) &&
               (uVar22 = (uint)fVar29 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar29 >> 0x17),
               uVar17 = uVar17 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar29 < 0x7f800000) {
            if ((uint)fVar29 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar29 != INFINITY) {
              uVar22 = (uint)fVar29 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar22 | (ushort)(uVar22 == 0);
            }
          }
          (pRVar12->r)._h = uVar17;
          fVar31 = *(float *)(lVar13 + (ulong)(pRVar12->g)._h * 4) * fVar32;
          fVar29 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar29 < 0x38800000) {
            if ((0x33000000 < (uint)fVar29) &&
               (uVar22 = (uint)fVar29 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar29 >> 0x17),
               uVar17 = uVar17 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar29 < 0x7f800000) {
            if ((uint)fVar29 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar29 != INFINITY) {
              uVar22 = (uint)fVar29 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar22 | (ushort)(uVar22 == 0);
            }
          }
          (pRVar12->g)._h = uVar17;
          fVar31 = *(float *)(lVar13 + (ulong)(pRVar12->b)._h * 4) * fVar32;
          fVar29 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar29 < 0x38800000) {
            if ((0x33000000 < (uint)fVar29) &&
               (uVar22 = (uint)fVar29 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar29 >> 0x17),
               uVar17 = uVar17 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar29 < 0x7f800000) {
            if ((uint)fVar29 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar29 != INFINITY) {
              uVar22 = (uint)fVar29 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar22 | (ushort)(uVar22 == 0);
            }
          }
          (pRVar12->b)._h = uVar17;
          fVar31 = *(float *)(lVar13 + (ulong)(pRVar12->a)._h * 4) * fVar32;
          fVar29 = ABS(fVar31);
          uVar17 = (ushort)((uint)fVar31 >> 0x10) & 0x8000;
          if ((uint)fVar29 < 0x38800000) {
            if ((0x33000000 < (uint)fVar29) &&
               (cVar2 = (char)((uint)fVar29 >> 0x17), uVar22 = (uint)fVar29 & 0x7fffff | 0x800000,
               uVar17 = uVar17 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
               0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
              uVar17 = uVar17 + 1;
            }
          }
          else if ((uint)fVar29 < 0x7f800000) {
            if ((uint)fVar29 < 0x477ff000) {
              uVar17 = (ushort)((int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0) >>
                               0xd) | uVar17;
            }
            else {
              uVar17 = uVar17 | 0x7c00;
            }
          }
          else {
            uVar17 = uVar17 | 0x7c00;
            if (fVar29 != INFINITY) {
              uVar22 = (uint)fVar29 >> 0xd & 0x3ff;
              uVar17 = uVar17 | (ushort)uVar22 | (ushort)(uVar22 == 0);
            }
          }
          (pRVar12->a)._h = uVar17;
          pRVar12 = pRVar12 + 1;
        } while (pRVar12 < pRVar1);
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    generating blurred image",0x1c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
      }
      pBVar7 = EnvmapImage::dataWindow(local_d0);
      local_148.min = pBVar7->min;
      local_148.max = pBVar7->max;
      iVar21 = Imf_3_2::CubeMap::sizeOfFace((Box *)&local_148);
      BStack_f8.min.x = 0;
      BStack_f8.min.y = 0;
      BStack_f8.max.x = 99;
      BStack_f8.max.y = 599;
      iVar15 = Imf_3_2::CubeMap::sizeOfFace((Box *)&BStack_f8);
      EnvmapImage::resize(local_180,ENVMAP_CUBE,&BStack_f8);
      EnvmapImage::clear(local_180);
      pAVar9 = EnvmapImage::pixels(local_d0);
      pAStack_150 = EnvmapImage::pixels(local_180);
      uVar22 = 0;
      do {
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"        face ",0xd);
          plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar22);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
        }
        if (0 < iVar15) {
          iVar6 = 0;
          pfStack_168 = (float *)CONCAT44(pfStack_168._4_4_,uVar22);
          do {
            pfStack_158 = (float *)CONCAT44(pfStack_158._4_4_,iVar6);
            iVar16 = 0;
            do {
              local_130 = CONCAT44(local_130._4_4_,iVar16);
              fStack_170 = (float)iVar16;
              fStack_16c = (float)iVar6;
              Imf_3_2::CubeMap::direction
                        ((CubeMapFace)&fStack_120,(Box *)(ulong)uVar22,(Vec2 *)&BStack_f8);
              uStack_70 = CONCAT44(fStack_16c,fStack_170);
              Imf_3_2::CubeMap::pixelPosition(&fStack_160,uVar22,&BStack_f8,&uStack_70);
              local_128 = pAStack_150->_data + (long)(int)(fStack_15c + 0.5) * pAStack_150->_sizeY;
              lStack_110 = (long)(int)(fStack_160 + 0.5);
              auStack_a8 = ZEXT416(0);
              uStack_e8 = 0.0;
              pBVar23 = (Box *)0x0;
              local_108 = ZEXT816(0);
              do {
                if (0 < iVar21) {
                  iVar16 = 0;
                  do {
                    auStack_98._0_4_ = (float)iVar16;
                    iVar19 = 0;
                    do {
                      fStack_178 = (float)iVar19;
                      uStack_174 = auStack_98._0_4_;
                      Imf_3_2::CubeMap::direction
                                ((CubeMapFace)&fStack_b4,pBVar23,(Vec2 *)&local_148);
                      uStack_78 = CONCAT44(uStack_174,fStack_178);
                      Imf_3_2::CubeMap::pixelPosition(&fStack_80,pBVar23,&local_148,&uStack_78);
                      fVar32 = fStack_ac * fStack_118 +
                               fStack_b4 * fStack_120 + fStack_b0 * fStack_11c;
                      if (0.0 < fVar32) {
                        lVar13 = (long)(int)(fStack_7c + 0.5) * pAVar9->_sizeY;
                        pRVar1 = pAVar9->_data;
                        dVar26 = (double)fVar32;
                        lVar11 = (long)(int)(fStack_80 + 0.5);
                        uStack_e8 = uStack_e8 + dVar26;
                        dVar27 = (double)auStack_a8._8_8_ +
                                 (double)*(float *)(_imath_half_to_float_table +
                                                   (ulong)pRVar1[lVar13 + lVar11].g._h * 4) * dVar26
                        ;
                        auStack_a8._8_4_ = SUB84(dVar27,0);
                        auStack_a8._0_8_ =
                             (double)auStack_a8._0_8_ +
                             (double)*(float *)(_imath_half_to_float_table +
                                               (ulong)pRVar1[lVar13 + lVar11].r._h * 4) * dVar26;
                        auStack_a8._12_4_ = (int)((ulong)dVar27 >> 0x20);
                        local_108._0_8_ =
                             (double)local_108._0_8_ +
                             dVar26 * (double)*(float *)(_imath_half_to_float_table +
                                                        (ulong)pRVar1[lVar13 + lVar11].b._h * 4);
                        local_108._8_8_ =
                             (double)local_108._8_8_ +
                             dVar26 * (double)*(float *)(_imath_half_to_float_table +
                                                        (ulong)pRVar1[lVar13 + lVar11].a._h * 4);
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar21 != iVar19);
                    iVar16 = iVar16 + 1;
                  } while (iVar16 != iVar21);
                }
                uVar22 = (int)pBVar23 + 1;
                pBVar23 = (Box *)(ulong)uVar22;
              } while (uVar22 != 6);
              fVar32 = ABS((float)((double)auStack_a8._0_8_ / uStack_e8));
              uVar4 = (ushort)((uint)(float)((double)auStack_a8._0_8_ / uStack_e8) >> 0x10) & 0x8000
              ;
              if ((uint)fVar32 < 0x38800000) {
                if ((0x33000000 < (uint)fVar32) &&
                   (uVar22 = (uint)fVar32 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar32 >> 0x17),
                   uVar4 = uVar4 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar4 = uVar4 + 1;
                }
              }
              else if ((uint)fVar32 < 0x7f800000) {
                if ((uint)fVar32 < 0x477ff000) {
                  uVar4 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar4;
                }
                else {
                  uVar4 = uVar4 | 0x7c00;
                }
              }
              else {
                uVar4 = uVar4 | 0x7c00;
                if (fVar32 != INFINITY) {
                  uVar22 = (uint)fVar32 >> 0xd & 0x3ff;
                  uVar4 = uVar4 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                }
              }
              local_128[lStack_110].r._h = uVar4;
              fVar32 = ABS((float)((double)auStack_a8._8_8_ / uStack_e8));
              uVar4 = (ushort)((uint)(float)((double)auStack_a8._8_8_ / uStack_e8) >> 0x10) & 0x8000
              ;
              if ((uint)fVar32 < 0x38800000) {
                if ((0x33000000 < (uint)fVar32) &&
                   (uVar22 = (uint)fVar32 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar32 >> 0x17),
                   uVar4 = uVar4 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar4 = uVar4 + 1;
                }
              }
              else if ((uint)fVar32 < 0x7f800000) {
                if ((uint)fVar32 < 0x477ff000) {
                  uVar4 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar4;
                }
                else {
                  uVar4 = uVar4 | 0x7c00;
                }
              }
              else {
                uVar4 = uVar4 | 0x7c00;
                if (fVar32 != INFINITY) {
                  uVar22 = (uint)fVar32 >> 0xd & 0x3ff;
                  uVar4 = uVar4 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                }
              }
              local_128[lStack_110].g._h = uVar4;
              fVar32 = ABS((float)((double)local_108._0_8_ / uStack_e8));
              uVar4 = (ushort)((uint)(float)((double)local_108._0_8_ / uStack_e8) >> 0x10) & 0x8000;
              if ((uint)fVar32 < 0x38800000) {
                if ((0x33000000 < (uint)fVar32) &&
                   (uVar22 = (uint)fVar32 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar32 >> 0x17),
                   uVar4 = uVar4 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar4 = uVar4 + 1;
                }
              }
              else if ((uint)fVar32 < 0x7f800000) {
                if ((uint)fVar32 < 0x477ff000) {
                  uVar4 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar4;
                }
                else {
                  uVar4 = uVar4 | 0x7c00;
                }
              }
              else {
                uVar4 = uVar4 | 0x7c00;
                if (fVar32 != INFINITY) {
                  uVar22 = (uint)fVar32 >> 0xd & 0x3ff;
                  uVar4 = uVar4 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                }
              }
              local_128[lStack_110].b._h = uVar4;
              fVar32 = ABS((float)((double)local_108._8_8_ / uStack_e8));
              uVar4 = (ushort)((uint)(float)((double)local_108._8_8_ / uStack_e8) >> 0x10) & 0x8000;
              if ((uint)fVar32 < 0x38800000) {
                if ((0x33000000 < (uint)fVar32) &&
                   (uVar22 = (uint)fVar32 & 0x7fffff | 0x800000,
                   cVar2 = (char)((uint)fVar32 >> 0x17),
                   uVar4 = uVar4 | (ushort)(uVar22 >> (0x7eU - cVar2 & 0x1f)),
                   0x80000000 < uVar22 << (cVar2 + 0xa2U & 0x1f))) {
                  uVar4 = uVar4 + 1;
                }
              }
              else if ((uint)fVar32 < 0x7f800000) {
                if ((uint)fVar32 < 0x477ff000) {
                  uVar4 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0)
                                  >> 0xd) | uVar4;
                }
                else {
                  uVar4 = uVar4 | 0x7c00;
                }
              }
              else {
                uVar4 = uVar4 | 0x7c00;
                if (fVar32 != INFINITY) {
                  uVar22 = (uint)fVar32 >> 0xd & 0x3ff;
                  uVar4 = uVar4 | (ushort)uVar22 | (ushort)(uVar22 == 0);
                }
              }
              local_128[lStack_110].a._h = uVar4;
              iVar16 = (int)local_130 + 1;
              uVar22 = (uint)pfStack_168;
            } while (iVar16 != iVar15);
            iVar6 = (int)pfStack_158 + 1;
            pEVar20 = local_c8;
          } while (iVar6 != iVar15);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != 6);
      if (local_180 != pEVar20) {
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    copying",0xb);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        pBVar7 = EnvmapImage::dataWindow(local_180);
        local_148.min = pBVar7->min;
        local_148.max = pBVar7->max;
        EnvmapImage::resize(pEVar20,ENVMAP_CUBE,&local_148);
        iVar21 = local_148.max.x - local_148.min.x;
        iVar15 = local_148.max.y - local_148.min.y;
        pAVar9 = EnvmapImage::pixels(pEVar20);
        pRVar1 = pAVar9->_data;
        pAVar9 = EnvmapImage::pixels(local_180);
        memcpy(pRVar1,pAVar9->_data,(long)((iVar15 + 1) * (iVar21 + 1)) << 3);
      }
      if (local_60._pixels._data != (Rgba *)0x0) {
        operator_delete__(local_60._pixels._data);
      }
      return;
    }
  } while( true );
}

Assistant:

void
blurImage (EnvmapImage& image1, bool verbose)
{
    //
    // Ideally we would blur the input image directly by convolving
    // it with a 180-degree wide blur kernel.  Unfortunately this
    // is prohibitively expensive when the input image is large.
    // In order to keep running times reasonable, we perform the
    // blur on a small proxy image that will later be re-sampled
    // to the desired output resolution.
    //
    // Here's how it works:
    //
    // * If the input image is in latitude-longitude format,
    //   convert it into a cube-face environment map.
    //
    // * Repeatedly resample the image, each time shrinking
    //   it to no less than half its current size, until the
    //   width of each cube face is MAX_IN_WIDTH pixels.
    //
    // * Multiply each pixel by a weight that is proportional
    //   to the solid angle subtended by the pixel as seen
    //   from the center of the environment cube.
    //
    // * Create an output image in cube-face format.
    //   The cube faces of the output image are OUT_WIDTH
    //   pixels wide.
    //
    // * For each pixel of the output image:
    //
    //       Set the output pixel's color to black
    //
    //       Determine the direction, d2, from the center of the
    //       output environment cube to the center of the output
    //	     pixel.
    //
    //       For each pixel of the input image:
    //
    //           Determine the direction, d1, from the center of
    //           the input environment cube to the center of the
    //           input pixel.
    //
    //           Multiply the input pixel's color by max (0, d1.dot(d2))
    //           and add the result to the output pixel.
    //

    const int MAX_IN_WIDTH = 40;
    const int OUT_WIDTH    = 100;

    if (verbose) cout << "blurring map image" << endl;

    EnvmapImage  image2;
    EnvmapImage* iptr1 = &image1;
    EnvmapImage* iptr2 = &image2;

    int w = image1.dataWindow ().max.x - image1.dataWindow ().min.x + 1;
    int h = w * 6;

    if (iptr1->type () == ENVMAP_LATLONG)
    {
        //
        // Convert the input image from latitude-longitude
        // to cube-face format.
        //

        if (verbose) cout << "    converting to cube-face format" << endl;

        w /= 4;
        h = w * 6;

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    while (w > MAX_IN_WIDTH)
    {
        //
        // Shrink the image.
        //

        if (w >= MAX_IN_WIDTH * 2)
            w /= 2;
        else
            w = MAX_IN_WIDTH;

        h = w * 6;

        if (verbose)
        {
            cout << "    resizing cube faces "
                    "to "
                 << w << " by " << w << " pixels" << endl;
        }

        Box2i dw (V2i (0, 0), V2i (w - 1, h - 1));
        resizeCube (*iptr1, *iptr2, dw, 1, 7);

        swap (iptr1, iptr2);
    }

    if (verbose) cout << "    computing pixel weights" << endl;

    {
        //
        // Multiply each pixel by a weight that is proportional
        // to the solid angle subtended by the pixel.
        //

        Box2i dw  = iptr1->dataWindow ();
        int   sof = CubeMap::sizeOfFace (dw);

        Array2D<Rgba>& pixels = iptr1->pixels ();

        double weightTotal = 0;

        for (int f = CUBEFACE_POS_X; f <= CUBEFACE_NEG_Z; ++f)
        {
            if (verbose) cout << "        face " << f << endl;

            CubeMapFace face = CubeMapFace (f);
            V3f         faceDir (0, 0, 0);
            int         ix = 0, iy = 0, iz = 0;

            switch (face)
            {
                case CUBEFACE_POS_X:
                    faceDir = V3f (1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_X:
                    faceDir = V3f (-1, 0, 0);
                    ix      = 0;
                    iy      = 1;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Y:
                    faceDir = V3f (0, 1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_NEG_Y:
                    faceDir = V3f (0, -1, 0);
                    ix      = 1;
                    iy      = 0;
                    iz      = 2;
                    break;

                case CUBEFACE_POS_Z:
                    faceDir = V3f (0, 0, 1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;

                case CUBEFACE_NEG_Z:
                    faceDir = V3f (0, 0, -1);
                    ix      = 2;
                    iy      = 0;
                    iz      = 1;
                    break;
            }

            for (int y = 0; y < sof; ++y)
            {
                bool yEdge = (y == 0 || y == sof - 1);

                for (int x = 0; x < sof; ++x)
                {
                    bool xEdge = (x == 0 || x == sof - 1);

                    V2f posInFace (x, y);

                    V3f dir =
                        CubeMap::direction (face, dw, posInFace).normalized ();

                    V2f pos = CubeMap::pixelPosition (face, dw, posInFace);

                    //
                    // The solid angle subtended by pixel (x,y), as seen
                    // from the center of the cube, is proportional to the
                    // square of the distance of the pixel from the center
                    // of the cube and proportional to the dot product of
                    // the viewing direction and the normal of the cube
                    // face that contains the pixel.
                    //

                    double weight =
                        (dir ^ faceDir) *
                        (sqr (dir[iy] / dir[ix]) + sqr (dir[iz] / dir[ix]) + 1);

                    //
                    // Pixels at the edges and corners of the
                    // cube are duplicated; we must adjust the
                    // pixel weights accordingly.
                    //

                    if (xEdge && yEdge)
                        weight /= 3;
                    else if (xEdge || yEdge)
                        weight /= 2;

                    Rgba& pixel = pixels[toInt (pos.y)][toInt (pos.x)];

                    pixel.r *= weight;
                    pixel.g *= weight;
                    pixel.b *= weight;
                    pixel.a *= weight;

                    weightTotal += weight;
                }
            }
        }

        //
        // The weighting operation above has made the overall image darker.
        // Apply a correction to recover the image's original brightness.
        //

        int    w         = dw.max.x - dw.min.x + 1;
        int    h         = dw.max.y - dw.min.y + 1;
        size_t numPixels = w * h;
        double weight    = numPixels / weightTotal;

        Rgba* p   = &pixels[0][0];
        Rgba* end = p + numPixels;

        while (p < end)
        {
            p->r *= weight;
            p->g *= weight;
            p->b *= weight;
            p->a *= weight;

            ++p;
        }
    }

    {
        if (verbose) cout << "    generating blurred image" << endl;

        Box2i dw1  = iptr1->dataWindow ();
        int   sof1 = CubeMap::sizeOfFace (dw1);

        Box2i dw2 (V2i (0, 0), V2i (OUT_WIDTH - 1, OUT_WIDTH * 6 - 1));
        int   sof2 = CubeMap::sizeOfFace (dw2);

        iptr2->resize (ENVMAP_CUBE, dw2);
        iptr2->clear ();

        Array2D<Rgba>& pixels1 = iptr1->pixels ();
        Array2D<Rgba>& pixels2 = iptr2->pixels ();

        for (int f2 = CUBEFACE_POS_X; f2 <= CUBEFACE_NEG_Z; ++f2)
        {
            if (verbose) cout << "        face " << f2 << endl;

            CubeMapFace face2 = CubeMapFace (f2);

            for (int y2 = 0; y2 < sof2; ++y2)
            {
                for (int x2 = 0; x2 < sof2; ++x2)
                {
                    V2f posInFace2 (x2, y2);

                    V3f dir2 = CubeMap::direction (face2, dw2, posInFace2);

                    V2f pos2 = CubeMap::pixelPosition (face2, dw2, posInFace2);

                    double weightTotal = 0;
                    double rTotal      = 0;
                    double gTotal      = 0;
                    double bTotal      = 0;
                    double aTotal      = 0;

                    Rgba& pixel2 = pixels2[toInt (pos2.y)][toInt (pos2.x)];

                    for (int f1 = CUBEFACE_POS_X; f1 <= CUBEFACE_NEG_Z; ++f1)
                    {
                        CubeMapFace face1 = CubeMapFace (f1);

                        for (int y1 = 0; y1 < sof1; ++y1)
                        {
                            for (int x1 = 0; x1 < sof1; ++x1)
                            {
                                V2f posInFace1 (x1, y1);

                                V3f dir1 =
                                    CubeMap::direction (face1, dw1, posInFace1);

                                V2f pos1 = CubeMap::pixelPosition (
                                    face1, dw1, posInFace1);

                                double weight = dir1 ^ dir2;

                                if (weight <= 0) continue;

                                Rgba& pixel1 =
                                    pixels1[toInt (pos1.y)][toInt (pos1.x)];

                                weightTotal += weight;
                                rTotal += pixel1.r * weight;
                                gTotal += pixel1.g * weight;
                                bTotal += pixel1.b * weight;
                                aTotal += pixel1.a * weight;
                            }
                        }
                    }

                    pixel2.r = rTotal / weightTotal;
                    pixel2.g = gTotal / weightTotal;
                    pixel2.b = bTotal / weightTotal;
                    pixel2.a = aTotal / weightTotal;
                }
            }
        }

        swap (iptr1, iptr2);
    }

    //
    // Depending on how many times we've re-sampled the image,
    // the result is now either in image1 or in image2.
    // If necessary, copy the result into image1.
    //

    if (iptr1 != &image1)
    {
        if (verbose) cout << "    copying" << endl;

        Box2i dw = iptr1->dataWindow ();
        image1.resize (ENVMAP_CUBE, dw);

        int    w    = dw.max.x - dw.min.x + 1;
        int    h    = dw.max.y - dw.min.y + 1;
        size_t size = w * h * sizeof (Rgba);

        memcpy (&image1.pixels ()[0][0], &iptr1->pixels ()[0][0], size);
    }
}